

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O3

void __thiscall
stateObservation::LipmDcmEstimator::LipmDcmEstimator
          (LipmDcmEstimator *this,double dt,double omega_0,double biasDriftStd,
          double dcmMeasureErrorStd,double zmpMeasureErrorStd,Vector2 *biasLimit,Vector2 *initZMP,
          Vector2 *initDcm,Vector2 *initBias,Vector2 *initDcmUncertainty,
          Vector2 *initBiasUncertainty)

{
  LinearKalmanFilter *this_00;
  Index *pIVar1;
  double dVar2;
  double dVar3;
  Index IVar4;
  DenseStorage<double,_4,_2,_2,_0> *pDVar5;
  ActualDstType actualDst_1;
  ulong uVar6;
  double *pdVar7;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar8;
  undefined8 *puVar9;
  Matrix4 *pMVar10;
  Matrix24 *pMVar11;
  char *pcVar12;
  long lVar13;
  SrcEvaluatorType srcEvaluator;
  Matrix<double,_2,_4,_0,_2,_4> *other;
  int iVar14;
  Matrix4 P;
  Vector4 x;
  DenseStorage<double,__1,__1,__1,_0> local_148;
  long local_130;
  DenseStorage<double,__1,__1,__1,_0> local_128;
  Index local_110 [2];
  double dStack_100;
  Vector2 *local_a8;
  double local_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_78 [8];
  undefined8 local_70;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_68 [8];
  undefined8 local_60;
  DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> local_58 [16];
  undefined1 local_48 [16];
  
  this->omega0_ = omega_0;
  (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
  [0] = 0.0;
  (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  this->kappa_ = 1.0;
  this->dt_ = dt;
  this->biasDriftStd_ = biasDriftStd;
  this->zmpErrorStd_ = zmpMeasureErrorStd;
  this->needUpdateMatrices_ = true;
  dVar2 = (initZMP->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
          array[1];
  (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
  .array[0] = (initZMP->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
              m_data.array[0];
  (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
  .array[1] = dVar2;
  dVar2 = (biasLimit->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
          .array[1];
  (this->biasLimit_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = (biasLimit->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
             m_data.array[0];
  (this->biasLimit_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = dVar2;
  this_00 = &this->filter_;
  local_a8 = initDcmUncertainty;
  local_a0 = dcmMeasureErrorStd;
  KalmanFilterBase::KalmanFilterBase(&this_00->super_KalmanFilterBase,4,2,4);
  (this->filter_).super_KalmanFilterBase.super_ZeroDelayObserver.super_ObserverBase.
  _vptr_ObserverBase = (_func_int **)&PTR__LinearKalmanFilter_001b4368;
  (this->filter_).super_KalmanFilterBase.super_StateVectorArithmetics._vptr_StateVectorArithmetics =
       (_func_int **)&PTR_stateSum_001b45c8;
  (this->filter_).d_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->filter_).d_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->filter_).d_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->filter_).b_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->filter_).b_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->filter_).b_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  pMVar10 = &this->A_;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[0] = 1.0;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[1] = 0.0;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[2] = 0.0;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[3] = 1.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xb] = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xc] = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xd] = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xe] = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xf] = 0.0;
  lVar13 = 0x340;
  do {
    (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = 1.0;
    lVar13 = lVar13 + 0x20;
    pMVar10 = (Matrix4 *)
              ((pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array + 5);
  } while (lVar13 != 0x3c0);
  pMVar10 = &this->Q_;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xe] = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xf] = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xc] = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xd] = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xb] = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xe] = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xf] = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xc] = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xd] = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xb] = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
       = 0.0;
  lVar13 = 0x4a0;
  do {
    (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = 1.0;
    lVar13 = lVar13 + 0x20;
    pMVar10 = (Matrix4 *)
              ((pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array + 5);
  } while (lVar13 != 0x520);
  updateMatricesABQ_(this);
  pMVar11 = &this->C_;
  local_128.m_rows = 0;
  local_128.m_data = (double *)pMVar11;
  local_128.m_cols = 2;
  local_110[0] = 2;
  lVar13 = 0;
  do {
    iVar14 = (int)((ulong)lVar13 >> 0x20);
    *(undefined4 *)
     (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>).m_storage.m_data.array
         = 0;
    *(uint *)((long)(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>).
                    m_storage.m_data.array + 4) =
         -(uint)((int)lVar13 == 0 && iVar14 == 0) & 0x3ff00000;
    *(undefined4 *)
     ((pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>).m_storage.m_data.array
     + 1) = 0;
    *(uint *)((long)(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>).
                    m_storage.m_data.array + 0xc) =
         -(uint)((int)lVar13 == 1 && iVar14 == 0) & 0x3ff00000;
    lVar13 = lVar13 + 1;
    pMVar11 = (Matrix24 *)
              ((pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>).m_storage.
               m_data.array + 2);
  } while (lVar13 != 2);
  Eigen::CommaInitializer<Eigen::Matrix<double,2,4,0,2,4>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,2,4,0,2,4>> *)&local_128,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              *)&local_98);
  if ((local_110[0] + local_128.m_rows == 2) && (local_128.m_cols == 4)) {
    (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [0] = local_a0 * local_a0;
    pDVar5 = &(this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage;
    (pDVar5->m_data).array[1] = 0.0;
    (pDVar5->m_data).array[2] = 0.0;
    (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [3] = local_a0 * local_a0;
    local_128.m_data = (double *)0x0;
    local_128.m_rows = 0;
    local_128.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_128,8,2,4);
    if ((local_128.m_rows != 2) || (local_128.m_cols != 4)) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_128,8,2,4);
      if ((local_128.m_rows != 2) || (local_128.m_cols != 4)) {
        pcVar12 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 2, 4>, T1 = double, T2 = double]"
        ;
        goto LAB_0017d92e;
      }
    }
    uVar6 = 0xfffffffffffffffe;
    do {
      pdVar7 = (this->C_).super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.
               m_data.array + uVar6 + 2;
      dVar2 = pdVar7[1];
      local_128.m_data[uVar6 + 2] = *pdVar7;
      (local_128.m_data + uVar6 + 2)[1] = dVar2;
      uVar6 = uVar6 + 2;
    } while (uVar6 < 6);
    KalmanFilterBase::setC(&this_00->super_KalmanFilterBase,(Cmatrix *)&local_128);
    free(local_128.m_data);
    local_128.m_data = (double *)0x0;
    local_128.m_rows = 0;
    local_128.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_128,4,2,2);
    if ((local_128.m_rows != 2) || (local_128.m_cols != 2)) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_128,4,2,2);
      if ((local_128.m_rows != 2) || (local_128.m_cols != 2)) {
        pcVar12 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 2, 2>, T1 = double, T2 = double]"
        ;
        goto LAB_0017d92e;
      }
    }
    dVar2 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
            .array[1];
    *local_128.m_data =
         (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
         array[0];
    local_128.m_data[1] = dVar2;
    dVar2 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
            .array[3];
    local_128.m_data[2] =
         (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
         array[2];
    local_128.m_data[3] = dVar2;
    (*(this->filter_).super_KalmanFilterBase.super_ZeroDelayObserver.super_ObserverBase.
      _vptr_ObserverBase[0x2e])(this_00);
    free(local_128.m_data);
    local_128.m_rows = 0;
    local_128.m_data = &local_98;
    local_128.m_cols = 1;
    local_110[0] = 2;
    local_98 = (initDcm->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
               m_data.array[0];
    dStack_90 = (initDcm->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                m_data.array[1];
    Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_128,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)initBias);
    if ((local_110[0] + local_128.m_rows == 4) && (local_128.m_cols == 1)) {
      pdVar7 = (double *)malloc(0x20);
      if (((ulong)pdVar7 & 0xf) != 0) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pdVar7 == (double *)0x0) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar9 = operator_delete;
        __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_128.m_rows = 4;
      *pdVar7 = local_98;
      pdVar7[1] = dStack_90;
      pdVar7[2] = local_88;
      pdVar7[3] = dStack_80;
      local_128.m_data = pdVar7;
      ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,(StateVector *)&local_128,0);
      free(local_128.m_data);
      dVar2 = (local_a8->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
              m_data.array[0];
      dStack_100 = (local_a8->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                   m_storage.m_data.array[1];
      dStack_100 = dStack_100 * dStack_100;
      local_148.m_rows = 0;
      local_148.m_cols = 2;
      local_130 = 2;
      local_128.m_rows = 0;
      local_128.m_data = (double *)(dVar2 * dVar2);
      local_110[1] = 0;
      local_60 = 0;
      local_148.m_data = (double *)&local_128;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_148,local_68);
      local_70 = 0;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar8,local_78);
      dVar2 = (initBiasUncertainty->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
              m_storage.m_data.array[0];
      dVar3 = (initBiasUncertainty->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
              m_storage.m_data.array[1];
      local_58[8] = (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)0x0;
      local_58[9] = (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)0x0;
      local_58[10] = (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)0x0;
      local_58[0xb] = (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)0x0;
      local_58[0xc] = (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)0x0;
      local_58[0xd] = (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)0x0;
      local_58[0xe] = (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)0x0;
      local_58[0xf] = (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)0x0;
      local_58._0_8_ = dVar2 * dVar2;
      local_48._8_8_ = 0;
      local_48._0_8_ = dVar3 * dVar3;
      local_48 = local_48 << 0x40;
      Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar8,local_58);
      if ((local_130 + local_148.m_rows == 4) && (local_148.m_cols == 4)) {
        local_148.m_data = (double *)0x0;
        local_148.m_rows = 0;
        local_148.m_cols = 0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_148,0x10,4,4);
        if ((local_148.m_rows != 4) || (local_148.m_cols != 4)) {
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_148,0x10,4,4);
          if ((local_148.m_rows != 4) || (local_148.m_cols != 4)) {
            pcVar12 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 4, 4>, T1 = double, T2 = double]"
            ;
LAB_0017d92e:
            __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar12);
          }
        }
        uVar6 = 0xfffffffffffffffe;
        do {
          IVar4 = local_110[uVar6];
          pIVar1 = (Index *)(&(((StateVector *)((long)local_148.m_data + 0x10))->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                              m_storage.m_data + uVar6);
          *pIVar1 = local_110[uVar6 - 1];
          pIVar1[1] = IVar4;
          uVar6 = uVar6 + 2;
        } while (uVar6 < 0xe);
        KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,(Pmatrix *)&local_148)
        ;
        free(local_148.m_data);
        return;
      }
      pcVar12 = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 4>>::finished() [MatrixType = Eigen::Matrix<double, 4, 4>]"
      ;
    }
    else {
      pcVar12 = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 1>>::finished() [MatrixType = Eigen::Matrix<double, 4, 1>]"
      ;
    }
  }
  else {
    pcVar12 = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 4>>::finished() [MatrixType = Eigen::Matrix<double, 2, 4>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar12);
}

Assistant:

LipmDcmEstimator::LipmDcmEstimator(double dt,
                                   double omega_0,
                                   double biasDriftStd,
                                   double dcmMeasureErrorStd,
                                   double zmpMeasureErrorStd,
                                   const Vector2 & biasLimit,
                                   const Vector2 & initZMP,
                                   const Vector2 & initDcm,
                                   const Vector2 & initBias,
                                   const Vector2 & initDcmUncertainty,
                                   const Vector2 & initBiasUncertainty)
: omega0_(omega_0), dt_(dt), biasDriftStd_(biasDriftStd), zmpErrorStd_(zmpMeasureErrorStd), previousZmp_(initZMP),
  biasLimit_(biasLimit), filter_(4, 2, 4), previousOrientation_(Matrix2::Identity())
{
  A_.setIdentity();
  B_.setZero();
  Q_.setIdentity();
  updateMatricesABQ_();
  C_ << Matrix2::Identity(), Matrix2::Identity();
  R_ = dblToSqDiag_(dcmMeasureErrorStd);
  filter_.setC(C_);
  filter_.setMeasurementCovariance(R_);
  Vector4 x;
  x << initDcm, initBias;
  filter_.setState(x, 0);
  Matrix4 P;
  // clang-format off
  P<< Vec2ToSqDiag_(initDcmUncertainty),  Matrix2::Zero(),
      Matrix2::Zero(),                   Vec2ToSqDiag_(initBiasUncertainty);
  // clang-format on
  filter_.setStateCovariance(P);
}